

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O2

adios2_error adios2_between_step_pairs(size_t *between_step_pairs,adios2_engine *engine)

{
  byte bVar1;
  allocator local_50 [32];
  string local_30;
  
  std::__cxx11::string::string
            ((string *)&local_30,"for adios2_engine, in call to adios2_between_step_pairs",local_50)
  ;
  adios2::helper::CheckForNullptr<adios2_engine_const>(engine,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  bVar1 = adios2::core::Engine::BetweenStepPairs();
  *between_step_pairs = (ulong)bVar1;
  return adios2_error_none;
}

Assistant:

adios2_error adios2_between_step_pairs(size_t *between_step_pairs, const adios2_engine *engine)
{
    try
    {
        adios2::helper::CheckForNullptr(engine,
                                        "for adios2_engine, in call to adios2_between_step_pairs");

        const adios2::core::Engine *engineCpp =
            reinterpret_cast<const adios2::core::Engine *>(engine);

        *between_step_pairs = engineCpp->BetweenStepPairs();
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_between_step_pairs"));
    }
}